

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v1
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v1,
          TPZFMatrix<std::complex<float>_> *invKc_rc)

{
  uint uVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  TPZFMatrix<std::complex<float>_> temp2;
  TPZFMatrix<std::complex<float>_> temp;
  
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&temp,(this->fCoarseIndex).fNElements,1);
  TPZFMatrix<std::complex<float>_>::TPZFMatrix(&temp2);
  for (lVar8 = 0; lVar8 < (this->fCoarseIndex).fNElements; lVar8 = lVar8 + 1) {
    pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                       (invKc_rc,(long)(this->fCoarseIndex).fStore[lVar8],0);
    pcVar5 = TPZFMatrix<std::complex<float>_>::operator()(&temp,lVar8,0);
    pcVar5->_M_value = pcVar4->_M_value;
  }
  uVar7 = 0;
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fPhiC).super_TPZMatrix<std::complex<float>_>,&temp,&temp2,0);
  uVar1 = (uint)(this->fGlobalEqs).fNElements;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pcVar4 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore;
    ppVar3 = (this->fGlobalEqs).fStore;
    lVar8 = (long)ppVar3[uVar7].first;
    iVar2 = ppVar3[uVar7].second;
    pcVar5 = TPZFMatrix<std::complex<float>_>::operator()(&temp2,lVar8,0);
    std::operator*(pcVar4 + lVar8,pcVar5);
    pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(v1,(long)iVar2,0);
    pcVar4->_M_value =
         CONCAT44(extraout_XMM0_Db + (float)(pcVar4->_M_value >> 0x20),
                  extraout_XMM0_Da + (float)pcVar4->_M_value);
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&temp2);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&temp);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v1(TPZFMatrix<TVar> &v1, TPZFMatrix<TVar> &invKc_rc) {
	int i;
	//  int j;
	TPZFMatrix<TVar> temp(fCoarseIndex.NElements(), 1);
	TPZFMatrix<TVar> temp2;
	//temp = R(ci)*K(c)_inverted*r(c)
	for (i=0;i<fCoarseIndex.NElements();i++) {
		temp(i, 0) = invKc_rc(fCoarseIndex[i],0);
	}
	//temp2 = Phi*temp
	fPhiC.Multiply(temp, temp2, 0);
	//v1 += R(i)_transposta*W(i)*temp2
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		temp2(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v1(ind.second,0) += fWeights[ind.first]*temp2(ind.first,0);
	}
}